

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureLayerAttachmentTest::Test
          (TextureLayerAttachmentTest *this,GLenum attachment,bool is_color_attachment,
          GLenum texture_target,GLenum internalformat,GLuint levels,GLint layers)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  uint layer;
  undefined4 extraout_var;
  uint uVar7;
  uint level;
  double dVar8;
  double dVar9;
  uint local_4c;
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar6 + 0x6f8))(1,&this->m_to);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x396);
  (**(code **)(lVar6 + 0xb8))(texture_target,this->m_to);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x399);
  dVar8 = (double)levels;
  if (texture_target == 0x9102) {
    pcVar1 = *(code **)(lVar6 + 0x13a8);
    dVar9 = exp2(dVar8);
    dVar8 = exp2(dVar8);
    (*pcVar1)(0x9102,1,internalformat,(long)dVar9 & 0xffffffff,(long)dVar8,layers,0);
    iVar4 = 0x39f;
  }
  else {
    pcVar1 = *(code **)(lVar6 + 0x1398);
    dVar9 = exp2(dVar8);
    dVar8 = exp2(dVar8);
    (*pcVar1)(texture_target,levels,internalformat,(long)dVar9 & 0xffffffff,(long)dVar8,layers);
    iVar4 = 0x3a5;
  }
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glRenderbufferStorage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,iVar4);
  (**(code **)(lVar6 + 0xb8))(texture_target,0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glBindRenderbuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x3a9);
  (**(code **)(lVar6 + 0x3c0))(1);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glCreateFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x3ad);
  for (level = 0; level != levels; level = level + 1) {
    local_4c = layers;
    if (texture_target == 0x806f) {
      dVar8 = exp2((double)level);
      local_4c = layers / (int)dVar8;
      if (layers < (int)local_4c) {
        local_4c = layers;
      }
    }
    uVar2 = 0;
    uVar7 = 1;
    while (layer = uVar2, layer < local_4c) {
      (**(code **)(lVar6 + 0xf40))(this->m_fbo,attachment,this->m_to,level,layer);
      bVar3 = SubTestAttachmentError(this,attachment,texture_target,level,layer,levels,layers);
      if (!bVar3) goto LAB_00af9af2;
      (**(code **)(lVar6 + 0x78))(0x8d40,this->m_fbo);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glBindFramebuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x3c4);
      if (is_color_attachment) {
        (**(code **)(lVar6 + 0x558))(attachment);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"glDrawBuffer has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x3c9);
        (**(code **)(lVar6 + 0x1218))(attachment);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"glReadBuffer has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x3cc);
      }
      bVar3 = SubTestStatus(this,attachment,texture_target,level,layer,levels,layers);
      if (!bVar3) goto LAB_00af9af2;
      if (texture_target != 0x9102) {
        Clear(this);
        bVar3 = SubTestContent(this,attachment,texture_target,internalformat,level,layer,levels,
                               layers);
        if (!bVar3) goto LAB_00af9af2;
      }
      (**(code **)(lVar6 + 0x78))(0x8d40,0);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glBindFramebuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x3df);
      uVar2 = uVar7 + layer;
      uVar7 = layer;
    }
  }
LAB_00af9af2:
  return levels <= level;
}

Assistant:

bool TextureLayerAttachmentTest::Test(glw::GLenum attachment, bool is_color_attachment, glw::GLenum texture_target,
									  glw::GLenum internalformat, glw::GLuint levels, glw::GLint layers)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* RBO creation. */
	gl.genTextures(1, &m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(texture_target, m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	if (GL_TEXTURE_2D_MULTISAMPLE_ARRAY == texture_target)
	{
		gl.texStorage3DMultisample(texture_target, 1, internalformat, (glw::GLuint)std::pow((double)2, (double)levels),
								   (glw::GLuint)std::pow((double)2, (double)levels), layers, GL_FALSE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");
	}
	else
	{
		gl.texStorage3D(texture_target, levels, internalformat, (glw::GLuint)std::pow((double)2, (double)levels),
						(glw::GLuint)std::pow((double)2, (double)levels), layers);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");
	}

	gl.bindTexture(texture_target, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer has failed");

	/* FBO creation. */
	gl.createFramebuffers(1, &m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateFramebuffers has failed");

	for (glw::GLuint i = 0; i < levels; ++i)
	{
		glw::GLuint j = 0;
		glw::GLuint k = 1;

		/* 3D textures are mipmapped also in depth directio, so number of layers to be tested must be limited. */
		glw::GLuint layers_at_level = (GL_TEXTURE_3D == texture_target) ?
										  (de::min(layers, layers / (glw::GLint)std::pow(2.0, (double)i))) :
										  layers;

		while (j < layers_at_level) /* Only layers with Fibonacci number index are tested to reduce the test time. */
		{
			/* Attach texture layer. */
			gl.namedFramebufferTextureLayer(m_fbo, attachment, m_to, i, j);

			if (!SubTestAttachmentError(attachment, texture_target, i, j, levels, layers))
			{
				return false;
			}

			gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

			if (is_color_attachment)
			{
				gl.drawBuffer(attachment);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawBuffer has failed");

				gl.readBuffer(attachment);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glReadBuffer has failed");
			}

			if (!SubTestStatus(attachment, texture_target, i, j, levels, layers))
			{
				return false;
			}

			if (GL_TEXTURE_2D_MULTISAMPLE_ARRAY != texture_target)
			{
				Clear();

				if (!SubTestContent(attachment, texture_target, internalformat, i, j, levels, layers))
				{
					return false;
				}
			}

			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

			/* Fibonacci number iteration. */
			int l = j;
			j	 = j + k;
			k	 = l;
		}
	}

	return true;
}